

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_6340f::OpenXrProgram::RenderFrame(OpenXrProgram *this)

{
  undefined8 *puVar1;
  float *pfVar2;
  pointer ppXVar3;
  pointer pXVar4;
  element_type *peVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  XrResult XVar9;
  mapped_type *pmVar10;
  char *sourceLocation;
  long lVar11;
  ulong __new_size;
  char *originator;
  pointer ppXVar12;
  long lVar13;
  ulong uVar14;
  uint32_t viewCountOutput;
  Swapchain viewSwapchain;
  vector<Cube,_std::allocator<Cube>_> cubes;
  vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
  projectionLayerViews;
  vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_> layers;
  uint32_t swapchainImageIndex;
  XrFrameEndInfo frameEndInfo;
  XrSwapchainImageAcquireInfo acquireInfo;
  XrCompositionLayerProjection layer;
  XrFrameState frameState;
  XrViewState viewState;
  XrFrameBeginInfo frameBeginInfo;
  XrFrameWaitInfo frameWaitInfo;
  XrViewLocateInfo viewLocateInfo;
  uint local_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  vector<Cube,_std::allocator<Cube>_> local_248;
  vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
  local_228;
  void *local_208;
  iterator iStack_200;
  XrCompositionLayerBaseHeader **local_1f8;
  uint local_1ec;
  XrCompositionLayerBaseHeader *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  undefined4 uStack_1b4;
  int local_1a8 [6];
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  XrSpace pXStack_170;
  undefined8 local_168;
  pointer pXStack_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined8 uStack_40;
  XrSpace local_38;
  
  if (this->m_session == (XrSession)0x0) {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Check failed","");
    Throw(&local_148,"m_session != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:866"
         );
  }
  local_68 = 0x21;
  uStack_60 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  local_c8 = 0x2c;
  XVar9 = xrWaitFrame();
  if (XVar9 < XR_SUCCESS) {
    originator = "xrWaitFrame(m_session, &frameWaitInfo, &frameState)";
    sourceLocation =
         "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:870"
    ;
  }
  else {
    local_78 = 0x2e;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    XVar9 = xrBeginFrame(this->m_session);
    uVar6 = local_b8;
    if (XR_ERROR_VALIDATION_FAILURE < XVar9) {
      local_208 = (void *)0x0;
      iStack_200._M_current = (XrCompositionLayerBaseHeader **)0x0;
      local_1f8 = (XrCompositionLayerBaseHeader **)0x0;
      uStack_180 = 0;
      local_168 = 0;
      pXStack_160 = (pointer)0x0;
      local_178 = 0;
      pXStack_170 = (XrSpace)0x0;
      local_188 = 0x23;
      local_228.
      super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228.
      super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.
      super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((int)local_a8 == 1) {
        local_88 = 0;
        local_98 = 0xb;
        uStack_94 = 0;
        uStack_90 = 0;
        uStack_8c = 0;
        uVar14 = (ulong)((long)(this->m_views).super__Vector_base<XrView,_std::allocator<XrView>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_views).super__Vector_base<XrView,_std::allocator<XrView>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 6;
        uStack_50 = 0;
        local_58 = 6;
        local_48 = (ulong)(((this->m_options).
                            super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          Parsed).ViewConfigType;
        uStack_40 = local_b8;
        local_38 = this->m_appSpace;
        XVar9 = xrLocateViews(this->m_session,&local_58,&local_98,uVar14 & 0xffffffff,&local_27c);
        if (XVar9 < XR_SUCCESS) {
          ThrowXrResult(XVar9,"xrLocateViews",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:906"
                       );
        }
        if (((uint)local_88 & 3) == 3) {
          __new_size = (ulong)local_27c;
          if (local_27c != (uint)uVar14) {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_e8.field_2._M_allocated_capacity = 0x6166206b63656843;
            local_e8.field_2._8_4_ = 0x64656c69;
            local_e8._M_string_length = 0xc;
            local_e8.field_2._M_local_buf[0xc] = '\0';
            Throw(&local_e8,"viewCountOutput == viewCapacityInput",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:912"
                 );
          }
          if (((long)(this->m_configViews).
                     super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_configViews).
                     super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 -
              __new_size != 0) {
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            local_108.field_2._M_allocated_capacity = 0x6166206b63656843;
            local_108.field_2._8_4_ = 0x64656c69;
            local_108._M_string_length = 0xc;
            local_108.field_2._M_local_buf[0xc] = '\0';
            Throw(&local_108,"viewCountOutput == m_configViews.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:913"
                 );
          }
          if ((long)(this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4 != __new_size) {
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            local_128.field_2._M_allocated_capacity = 0x6166206b63656843;
            local_128.field_2._8_4_ = 0x64656c69;
            local_128._M_string_length = 0xc;
            local_128.field_2._M_local_buf[0xc] = '\0';
            Throw(&local_128,"viewCountOutput == m_swapchains.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:914"
                 );
          }
          std::
          vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
          ::resize(&local_228,__new_size);
          local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.super__Vector_impl_data.
          _M_finish = (Cube *)0x0;
          local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (Cube *)0x0;
          ppXVar12 = (this->m_visualizedSpaces).
                     super__Vector_base<XrSpace_T_*,_std::allocator<XrSpace_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppXVar3 = (this->m_visualizedSpaces).
                    super__Vector_base<XrSpace_T_*,_std::allocator<XrSpace_T_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          local_190 = 3;
          if (ppXVar12 != ppXVar3) {
            do {
              uStack_1e0 = 0;
              local_1c8 = 0.0;
              fStack_1c4 = 0.0;
              fStack_1c0 = 0.0;
              fStack_1bc = 0.0;
              local_1d8 = 0;
              uStack_1d0 = (key_type)0x0;
              local_1b8 = 0.0;
              uStack_1b4 = 0;
              local_1e8 = (XrCompositionLayerBaseHeader *)0x2a;
              XVar9 = xrLocateSpace(*ppXVar12,this->m_appSpace,uVar6,&local_1e8);
              if (XVar9 < XR_SUCCESS) {
                ThrowXrResult(XVar9,"xrLocateSpace",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:924"
                             );
              }
              if (XVar9 == XR_SUCCESS) {
                if ((~(uint)local_1d8 & 3) == 0) {
                  local_268 = fStack_1c0;
                  fStack_264 = fStack_1bc;
                  fStack_260 = local_1b8;
                  local_278._0_8_ = uStack_1d0;
                  local_278._8_4_ = local_1c8;
                  local_278._12_4_ = fStack_1c4;
                  fStack_25c = 0.25;
                  fStack_258 = 0.25;
                  fStack_254 = 0.25;
                  if (local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<Cube,_std::allocator<Cube>_>::_M_realloc_insert<Cube>
                              (&local_248,
                               (iterator)
                               local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                               super__Vector_impl_data._M_finish,(Cube *)local_278);
                  }
                  else {
                    ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Scale).y = 0.25;
                    ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Scale).z = 0.25;
                    ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Pose).position.x = fStack_1c0;
                    ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Pose).position.y = fStack_1bc;
                    ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Pose).position.z = local_1b8;
                    ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Scale).x = 0.25;
                    *(key_type *)
                     &((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                        super__Vector_impl_data._M_finish)->Pose).orientation = uStack_1d0;
                    ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Pose).orientation.z = local_1c8;
                    ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Pose).orientation.w = fStack_1c4;
                    local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
              }
              else {
                Fmt_abi_cxx11_((string *)local_278,
                               "Unable to locate a visualized reference space in app space: %d",
                               (ulong)(uint)XVar9);
                Log::Write(Verbose,(string *)local_278);
                if ((key_type)local_278._0_8_ != (key_type)&local_268) {
                  operator_delete((void *)local_278._0_8_,CONCAT44(fStack_264,local_268) + 1);
                }
              }
              ppXVar12 = ppXVar12 + 1;
            } while (ppXVar12 != ppXVar3);
          }
          local_1a8[0] = 0;
          local_1a8[1] = 1;
          lVar13 = 0;
          do {
            lVar11 = (long)*(int *)((long)local_1a8 + lVar13);
            uStack_1e0 = 0;
            local_1c8 = 0.0;
            fStack_1c4 = 0.0;
            fStack_1c0 = 0.0;
            fStack_1bc = 0.0;
            local_1d8 = 0;
            uStack_1d0 = (key_type)0x0;
            local_1b8 = 0.0;
            uStack_1b4 = 0;
            local_1e8 = (XrCompositionLayerBaseHeader *)0x2a;
            XVar9 = xrLocateSpace((this->m_input).handSpace._M_elems[lVar11],this->m_appSpace,uVar6)
            ;
            if (XVar9 < XR_SUCCESS) {
              ThrowXrResult(XVar9,"xrLocateSpace",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:940"
                           );
            }
            if (XVar9 == XR_SUCCESS) {
              if ((~(uint)local_1d8 & 3) == 0) {
                fStack_25c = (this->m_input).handScale._M_elems[lVar11] * 0.1;
                local_268 = fStack_1c0;
                fStack_264 = fStack_1bc;
                fStack_260 = local_1b8;
                local_278._0_8_ = uStack_1d0;
                local_278._8_4_ = local_1c8;
                local_278._12_4_ = fStack_1c4;
                fStack_258 = fStack_25c;
                fStack_254 = fStack_25c;
                if (local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Cube,_std::allocator<Cube>_>::_M_realloc_insert<Cube>
                            (&local_248,
                             (iterator)
                             local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                             super__Vector_impl_data._M_finish,(Cube *)local_278);
                }
                else {
                  ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish)->Scale).y = fStack_25c;
                  ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish)->Scale).z = fStack_25c;
                  ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish)->Pose).position.x = fStack_1c0;
                  ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish)->Pose).position.y = fStack_1bc;
                  ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish)->Pose).position.z = local_1b8;
                  ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish)->Scale).x = fStack_25c;
                  *(key_type *)
                   &((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                      super__Vector_impl_data._M_finish)->Pose).orientation = uStack_1d0;
                  ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish)->Pose).orientation.z = local_1c8;
                  ((local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                    super__Vector_impl_data._M_finish)->Pose).orientation.w = fStack_1c4;
                  local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
            }
            else if ((this->m_input).handActive._M_elems[lVar11] == 1) {
              Fmt_abi_cxx11_((string *)local_278,
                             "Unable to locate %s hand action space in app space: %d",
                             &DAT_00119ae8 + *(int *)(&DAT_00119ae8 + lVar11 * 4));
              Log::Write(Verbose,(string *)local_278);
              if ((key_type)local_278._0_8_ != (key_type)&local_268) {
                operator_delete((void *)local_278._0_8_,CONCAT44(fStack_264,local_268) + 1);
              }
            }
            lVar13 = lVar13 + 4;
          } while (lVar13 != 8);
          if (local_27c != 0) {
            lVar11 = 0;
            lVar13 = 0;
            uVar14 = 0;
            do {
              puVar1 = (undefined8 *)
                       ((long)&((this->m_swapchains).
                                super__Vector_base<Swapchain,_std::allocator<Swapchain>_>._M_impl.
                                super__Vector_impl_data._M_start)->handle + lVar11);
              local_278._0_8_ = *puVar1;
              uVar6 = puVar1[1];
              local_278._8_4_ = (undefined4)uVar6;
              local_278._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
              local_1a8[0] = 0x37;
              local_1a8[1] = 0;
              local_1a8[2] = 0;
              local_1a8[3] = 0;
              XVar9 = xrAcquireSwapchainImage(local_278._0_8_,local_1a8,&local_1ec);
              if (XVar9 < XR_SUCCESS) {
                ThrowXrResult(XVar9,
                              "xrAcquireSwapchainImage(viewSwapchain.handle, &acquireInfo, &swapchainImageIndex)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:966"
                             );
              }
              local_1e8 = (XrCompositionLayerBaseHeader *)0x38;
              uStack_1e0 = 0;
              local_1d8 = 0x7fffffffffffffff;
              XVar9 = xrWaitSwapchainImage(local_278._0_8_,&local_1e8);
              if (XVar9 < XR_SUCCESS) {
                ThrowXrResult(XVar9,"xrWaitSwapchainImage(viewSwapchain.handle, &waitInfo)",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:970"
                             );
              }
              *(undefined4 *)
               ((long)&(local_228.
                        super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                        ._M_impl.super__Vector_impl_data._M_start)->type + lVar13) = 0x30;
              *(undefined8 *)
               (&(local_228.
                  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_0x4 + lVar13) = 0;
              *(undefined8 *)
               ((long)(&(local_228.
                         super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0x4 + lVar13) + 8) = 0;
              puVar1 = (undefined8 *)
                       ((long)&((local_228.
                                 super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pose).orientation.y +
                       lVar13);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)
                       ((long)&((local_228.
                                 super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pose).position.y +
                       lVar13);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)
                       ((long)&((local_228.
                                 super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->fov).angleUp + lVar13);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)
                       ((long)&((local_228.
                                 super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->subImage).swapchain +
                       lVar13 + 4);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)
                       ((long)&((local_228.
                                 super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->subImage).imageRect.
                               extent.width + lVar13);
              *puVar1 = 0;
              puVar1[1] = 0;
              pXVar4 = (this->m_views).super__Vector_base<XrView,_std::allocator<XrView>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pfVar2 = &(pXVar4->pose).orientation.x + lVar11;
              uVar6 = *(undefined8 *)pfVar2;
              uVar7 = *(undefined8 *)(pfVar2 + 2);
              pfVar2 = &(pXVar4->pose).orientation.w + lVar11;
              uVar8 = *(undefined8 *)(pfVar2 + 2);
              puVar1 = (undefined8 *)
                       ((long)&((local_228.
                                 super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pose).orientation.w +
                       lVar13);
              *puVar1 = *(undefined8 *)pfVar2;
              puVar1[1] = uVar8;
              puVar1 = (undefined8 *)
                       ((long)&((local_228.
                                 super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pose).orientation.x +
                       lVar13);
              *puVar1 = uVar6;
              puVar1[1] = uVar7;
              pfVar2 = &(((this->m_views).super__Vector_base<XrView,_std::allocator<XrView>_>.
                          _M_impl.super__Vector_impl_data._M_start)->fov).angleLeft + lVar11;
              uVar6 = *(undefined8 *)(pfVar2 + 2);
              puVar1 = (undefined8 *)
                       ((long)&((local_228.
                                 super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->fov).angleLeft + lVar13
                       );
              *puVar1 = *(undefined8 *)pfVar2;
              puVar1[1] = uVar6;
              *(undefined8 *)
               ((long)&((local_228.
                         super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                         ._M_impl.super__Vector_impl_data._M_start)->subImage).swapchain + lVar13) =
                   local_278._0_8_;
              *(undefined8 *)
               ((long)&((local_228.
                         super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                         ._M_impl.super__Vector_impl_data._M_start)->subImage).imageRect.offset.x +
               lVar13) = 0;
              *(ulong *)((long)&((local_228.
                                  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->subImage).imageRect.
                                extent.width + lVar13) = CONCAT44(local_278._12_4_,local_278._8_4_);
              pmVar10 = std::
                        map<XrSwapchain_T_*,_std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>,_std::less<XrSwapchain_T_*>,_std::allocator<std::pair<XrSwapchain_T_*const,_std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>_>_>_>
                        ::operator[](&this->m_swapchainImages,(key_type *)local_278);
              peVar5 = (this->m_graphicsPlugin).
                       super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (*peVar5->_vptr_IGraphicsPlugin[7])
                        (peVar5,(long)&(local_228.
                                        super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->type + lVar13,
                         (pmVar10->
                         super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[local_1ec],
                         this->m_colorSwapchainFormat,&local_248);
              local_158 = 0x39;
              uStack_154 = 0;
              uStack_150 = 0;
              uStack_14c = 0;
              XVar9 = xrReleaseSwapchainImage(local_278._0_8_,&local_158);
              if (XVar9 < XR_SUCCESS) {
                ThrowXrResult(XVar9,"xrReleaseSwapchainImage(viewSwapchain.handle, &releaseInfo)",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:983"
                             );
              }
              uVar14 = uVar14 + 1;
              lVar13 = lVar13 + 0x60;
              lVar11 = lVar11 + 0x10;
            } while (uVar14 < local_27c);
          }
          pXStack_170 = this->m_appSpace;
          local_178 = 6;
          if ((((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->Parsed).EnvironmentBlendMode != XR_ENVIRONMENT_BLEND_MODE_ALPHA_BLEND) {
            local_178 = 0;
          }
          local_168 = CONCAT44(local_168._4_4_,
                               (int)((ulong)((long)local_228.
                                                                                                      
                                                  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_228.
                                                  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                               -0x55555555);
          pXStack_160 = local_228.
                        super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if (local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_248.super__Vector_base<Cube,_std::allocator<Cube>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((int)local_190 == 3) {
            local_1e8 = (XrCompositionLayerBaseHeader *)&local_188;
            if (iStack_200._M_current == local_1f8) {
              std::
              vector<XrCompositionLayerBaseHeader*,std::allocator<XrCompositionLayerBaseHeader*>>::
              _M_realloc_insert<XrCompositionLayerBaseHeader*>
                        ((vector<XrCompositionLayerBaseHeader*,std::allocator<XrCompositionLayerBaseHeader*>>
                          *)&local_208,iStack_200,&local_1e8);
            }
            else {
              *iStack_200._M_current = local_1e8;
              iStack_200._M_current = iStack_200._M_current + 1;
            }
          }
        }
      }
      uStack_1e0 = 0;
      local_1e8 = (XrCompositionLayerBaseHeader *)0xc;
      local_1d8 = local_b8;
      uStack_1d0 = (key_type)
                   CONCAT44((int)((ulong)((long)iStack_200._M_current - (long)local_208) >> 3),
                            (((this->m_options).
                              super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->Parsed).EnvironmentBlendMode);
      local_1c8 = SUB84(local_208,0);
      fStack_1c4 = (float)((ulong)local_208 >> 0x20);
      XVar9 = xrEndFrame(this->m_session);
      if (XVar9 < XR_SUCCESS) {
        ThrowXrResult(XVar9,"xrEndFrame(m_session, &frameEndInfo)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:889"
                     );
      }
      if (local_228.
          super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_208 != (void *)0x0) {
        operator_delete(local_208,(long)local_1f8 - (long)local_208);
      }
      return;
    }
    originator = "xrBeginFrame(m_session, &frameBeginInfo)";
    sourceLocation =
         "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:873"
    ;
  }
  ThrowXrResult(XVar9,originator,sourceLocation);
}

Assistant:

void RenderFrame() override {
        CHECK(m_session != XR_NULL_HANDLE);

        XrFrameWaitInfo frameWaitInfo{XR_TYPE_FRAME_WAIT_INFO};
        XrFrameState frameState{XR_TYPE_FRAME_STATE};
        CHECK_XRCMD(xrWaitFrame(m_session, &frameWaitInfo, &frameState));

        XrFrameBeginInfo frameBeginInfo{XR_TYPE_FRAME_BEGIN_INFO};
        CHECK_XRCMD(xrBeginFrame(m_session, &frameBeginInfo));

        std::vector<XrCompositionLayerBaseHeader*> layers;
        XrCompositionLayerProjection layer{XR_TYPE_COMPOSITION_LAYER_PROJECTION};
        std::vector<XrCompositionLayerProjectionView> projectionLayerViews;
        if (frameState.shouldRender == XR_TRUE) {
            if (RenderLayer(frameState.predictedDisplayTime, projectionLayerViews, layer)) {
                layers.push_back(reinterpret_cast<XrCompositionLayerBaseHeader*>(&layer));
            }
        }

        XrFrameEndInfo frameEndInfo{XR_TYPE_FRAME_END_INFO};
        frameEndInfo.displayTime = frameState.predictedDisplayTime;
        frameEndInfo.environmentBlendMode = m_options->Parsed.EnvironmentBlendMode;
        frameEndInfo.layerCount = (uint32_t)layers.size();
        frameEndInfo.layers = layers.data();
        CHECK_XRCMD(xrEndFrame(m_session, &frameEndInfo));
    }